

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O2

void ReadConfigROM(BasePort *port,uint boardNum)

{
  uint uVar1;
  long lVar2;
  uint16_t uVar3;
  int iVar4;
  ostream *poVar5;
  size_t i;
  ulong uVar6;
  long lVar7;
  size_t i_1;
  ulong len;
  quadlet_t read_data;
  quadlet_t block_data [24];
  
  uVar6 = (ulong)boardNum & 0xff;
  iVar4 = (*port->_vptr_BasePort[0x23])(port,uVar6,0xfffff0000400,&read_data);
  if ((char)iVar4 != '\0') {
    poVar5 = std::operator<<((ostream *)&std::cout,"Configuration ROM: ");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "Testing with block read (first entry should be ROM, followed by bus info):"
                          );
  std::endl<char,std::char_traits<char>>(poVar5);
  iVar4 = (*port->_vptr_BasePort[0x26])(port,uVar6,0xfffff0000400,block_data,0x60);
  if ((char)iVar4 != '\0') {
    for (lVar7 = 0; lVar2 = std::cout, lVar7 != 0x18; lVar7 = lVar7 + 1) {
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = 8;
      poVar5 = std::operator<<(&std::cout,0x30);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"  ");
      if ((~(uint)lVar7 & 3) == 0) {
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Bus_Info length = ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  if (0x1ffffff <
      (block_data[0] >> 0x18 | (block_data[0] & 0xff0000) >> 8 | (block_data[0] & 0xff00) << 8 |
      block_data[0] << 0x18)) {
    len = (ulong)((block_data[0] & 0xff) << 2);
    uVar3 = ComputeCRC16((uchar *)(block_data + 1),len);
    poVar5 = std::operator<<((ostream *)&std::cout,"Bus_Info CRC: ROM = ");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,", Computed = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar1 = *(uint *)((long)block_data + len + 4);
    poVar5 = std::operator<<((ostream *)&std::cout,"Root_Directory length = ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar3 = ComputeCRC16((uchar *)((long)block_data + len + 8),
                         (ulong)((((uVar1 & 0xff00) << 8 | uVar1 << 0x18) >> 0x10) << 2));
    poVar5 = std::operator<<((ostream *)&std::cout,"Root_Dir CRC: ROM = ");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,", Computed = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "Testing again with block read (8th entry should be ROM, followed by bus info):"
                          );
  std::endl<char,std::char_traits<char>>(poVar5);
  iVar4 = (*port->_vptr_BasePort[0x26])(port,uVar6,0xfffff00003e4,block_data,0x60);
  if ((char)iVar4 != '\0') {
    for (lVar7 = 0; lVar2 = std::cout, lVar7 != 0x18; lVar7 = lVar7 + 1) {
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar2 + -0x18)) = 8;
      poVar5 = std::operator<<(&std::cout,0x30);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"  ");
      if ((~(uint)lVar7 & 3) == 0) {
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
    }
  }
  return;
}

Assistant:

void ReadConfigROM(BasePort *port, unsigned int boardNum)
{
    nodeaddr_t addr;
    quadlet_t read_data;
    quadlet_t block_data[24];
    addr = 0xfffff0000400;  // Configuration ROM address
    if (port->ReadQuadlet(boardNum, addr, read_data))
        std::cout << "Configuration ROM: " << std::hex << read_data << std::endl;
    std::cout << "Testing with block read (first entry should be ROM, followed by bus info):" << std::endl;
    if (port->ReadBlock(boardNum, addr, block_data, sizeof(block_data))) {
        for (size_t i = 0; i < sizeof(block_data)/sizeof(quadlet_t); i++) {
            std::cout << std::hex << std::setw(8) << std::setfill('0') << bswap_32(block_data[i]) << "  ";
            if (i%4 == 3) std::cout << std::endl;
        }
    }
    unsigned int bus_info_len = (bswap_32(block_data[0])&0xff000000) >> 24;
    std::cout << "Bus_Info length = " << bus_info_len << std::endl;
    if (bus_info_len > 1) {
        unsigned int bus_info_crc = bswap_32(block_data[0])&0x0000ffff;
        uint16_t crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(&block_data[1]), bus_info_len*sizeof(quadlet_t));
        std::cout << "Bus_Info CRC: ROM = " << std::hex << bus_info_crc << ", Computed = " << crc16 << std::dec << std::endl;
        unsigned int root_len = (bswap_32(block_data[bus_info_len+1])&0xffff0000) >> 16;
        unsigned int root_dir_crc = bswap_32(block_data[bus_info_len+1])&0x0000ffff;
        std::cout << "Root_Directory length = " << root_len << std::endl;
        crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(&block_data[bus_info_len+2]), root_len*sizeof(quadlet_t));
        std::cout << "Root_Dir CRC: ROM = " << std::hex << root_dir_crc << ", Computed = " << crc16 << std::dec << std::endl;
    }
    std::cout << std::endl;
    std::cout << "Testing again with block read (8th entry should be ROM, followed by bus info):" << std::endl;
    if (port->ReadBlock(boardNum, addr-7*sizeof(quadlet_t), block_data, sizeof(block_data))) {
        for (size_t i = 0; i < sizeof(block_data)/sizeof(quadlet_t); i++) {
            std::cout << std::hex << std::setw(8) << std::setfill('0') << bswap_32(block_data[i]) << "  ";
            if (i%4 == 3) std::cout << std::endl;
        }
    }
}